

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Cnf_AddCardinConstrTest(void)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vVars;
  sat_solver *s;
  long lVar5;
  uint uVar6;
  
  vVars = Vec_IntAlloc(8);
  vVars->nSize = 8;
  piVar1 = vVars->pArray;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    piVar1[lVar5] = (int)lVar5;
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,8);
  uVar6 = 1;
  Cnf_AddCardinConstrPairWise(s,vVars,2,1);
  do {
    iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar2 != 1) break;
    vVars->nSize = 0;
    printf("%3d : ",(ulong)uVar6);
    for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
      iVar3 = sat_solver_var_value(s,iVar2);
      iVar3 = Abc_Var2Lit(iVar2,iVar3);
      Vec_IntPush(vVars,iVar3);
      uVar4 = sat_solver_var_value(s,iVar2);
      printf("%d",(ulong)uVar4);
    }
    uVar6 = uVar6 + 1;
    putchar(10);
    iVar2 = sat_solver_addclause(s,vVars->pArray,vVars->pArray + vVars->nSize);
  } while (iVar2 != 0);
  sat_solver_delete(s);
  Vec_IntFree(vVars);
  return;
}

Assistant:

void Cnf_AddCardinConstrTest()
{
    int i, status, Count = 1, nVars = 8;
    Vec_Int_t * vVars = Vec_IntStartNatural( nVars );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars );
    //Cnf_AddCardinConstr( pSat, vVars );
    Cnf_AddCardinConstrPairWise( pSat, vVars, 2, 1 );
    while ( 1 )
    {
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( status != l_True )
            break;
        Vec_IntClear( vVars );
        printf( "%3d : ", Count++ );
        for ( i = 0; i < nVars; i++ )
        {
            Vec_IntPush( vVars, Abc_Var2Lit(i, sat_solver_var_value(pSat, i)) );
            printf( "%d", sat_solver_var_value(pSat, i) );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vVars), Vec_IntArray(vVars) + Vec_IntSize(vVars) );
        if ( status == 0 )
            break;
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vVars );
}